

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_cont_mgau.c
# Opt level: O2

int32 approx_cont_mgau_frame_eval
                (mdef_t *mdef,subvq_t *svq,gs_t *gs,mgau_model_t *g,fast_gmm_t *fastgmm,ascr_t *a,
                float32 *feat,int32 frame,int32 *cache_ci_senscr,ptmr_t *tm_ovrhd,logmath_t *logmath
                )

{
  int *piVar1;
  float fVar2;
  int32 svq_beam;
  int iVar3;
  int iVar4;
  int32 *piVar5;
  s3senid_t *psVar6;
  int32 *senscr;
  uint8 *puVar7;
  uint8 *puVar8;
  int *__base;
  downsampling_t *pdVar9;
  gau_select_t *pgVar10;
  int best_cid;
  int32 iVar11;
  int iVar12;
  gmm_select_t *pgVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  char *__assertion;
  int iVar17;
  int iVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  uint __line;
  int local_a4;
  int local_84;
  int32 single_el_list [2];
  
  single_el_list[0] = -1;
  single_el_list[1] = -1;
  svq_beam = fastgmm->gaus->subvqbeam;
  piVar5 = fastgmm->gmms->ci_occu;
  psVar6 = mdef->cd2cisen;
  senscr = a->senscr;
  puVar7 = a->sen_active;
  puVar8 = a->rec_sen_active;
  ptmr_start(tm_ovrhd);
  if (gs == (gs_t *)0x0) {
    best_cid = -1;
  }
  else {
    best_cid = gc_compute_closest_cw(gs,feat);
  }
  if (svq != (subvq_t *)0x0) {
    subvq_gautbl_eval_logs3(svq,feat,logmath);
  }
  pgVar13 = fastgmm->gmms;
  if (pgVar13->max_cd < mdef->n_sen - mdef->n_ci_sen) {
    ci = cache_ci_senscr;
    __base = pgVar13->idx;
    for (lVar15 = 0; lVar15 < g->n_mgau; lVar15 = lVar15 + 1) {
      iVar11 = mdef_is_cisenone(mdef,(s3senid_t)lVar15);
      if (iVar11 == 0) {
        if ((puVar7 == (uint8 *)0x0) || (puVar7[lVar15] != '\0')) {
          piVar5[psVar6[lVar15]] = piVar5[psVar6[lVar15]] + 1;
        }
      }
      else {
        piVar5[lVar15] = 0;
      }
    }
    for (lVar15 = 0; lVar15 < mdef->n_ci_sen; lVar15 = lVar15 + 1) {
      __base[lVar15] = (int)lVar15;
    }
    qsort(__base,(long)mdef->n_ci_sen,4,intcmp);
    iVar3 = cache_ci_senscr[*__base];
    pgVar13 = fastgmm->gmms;
    iVar18 = pgVar13->ci_pbeam;
    pgVar13->dyn_ci_pbeam = iVar18;
    uVar16 = 0;
    uVar14 = (ulong)(uint)mdef->n_ci_sen;
    if (mdef->n_ci_sen < 1) {
      uVar14 = uVar16;
    }
    iVar17 = 0;
    do {
      if (uVar14 == uVar16) goto LAB_00105cbf;
      piVar1 = __base + uVar16;
      if (cache_ci_senscr[*piVar1] <= iVar3 + iVar18) goto LAB_00105cbf;
      iVar17 = iVar17 + piVar5[*piVar1];
      uVar16 = uVar16 + 1;
    } while (iVar17 <= pgVar13->max_cd);
    iVar18 = cache_ci_senscr[*piVar1] - iVar3;
    pgVar13->dyn_ci_pbeam = iVar18;
  }
  else {
    iVar18 = pgVar13->ci_pbeam;
  }
LAB_00105cbf:
  fVar2 = (float)pgVar13->tighten_factor;
  ptmr_stop(tm_ovrhd);
  pdVar9 = fastgmm->downs;
  iVar3 = pdVar9->ds_ratio;
  if (iVar3 == 0) {
    __assertion = "fg->downs->ds_ratio != 0";
    __line = 0x73;
  }
  else {
    pgVar10 = fastgmm->gaus;
    if ((pdVar9->cond_ds < 1) || (pdVar9->dist_ds < 1)) {
      if (pdVar9->cond_ds < 1) {
        bVar20 = frame % iVar3 == 0;
      }
      else {
        bVar20 = true;
        if (pgVar10->rec_bstcid == best_cid) {
          if (pdVar9->skip_count < iVar3 + -1) {
            pdVar9->skip_count = pdVar9->skip_count + 1;
            bVar20 = false;
          }
          else {
            pdVar9->skip_count = 0;
          }
        }
      }
      pgVar10->rec_bstcid = best_cid;
      iVar3 = (int)(fVar2 * (float)iVar18);
      if (bVar20 != false) {
        iVar3 = iVar18;
      }
      iVar18 = -0x80000000;
      lVar15 = 6;
      local_a4 = 0;
      local_84 = 0;
      iVar17 = -0x80000000;
      for (lVar19 = 0; uVar14 = (ulong)g->n_mgau, lVar19 < (long)uVar14; lVar19 = lVar19 + 1) {
        if (puVar7 == (uint8 *)0x0) {
          bVar21 = true;
        }
        else {
          bVar21 = puVar7[lVar19] != '\0';
        }
        iVar11 = mdef_is_cisenone(mdef,(s3senid_t)lVar19);
        if (iVar11 == 0) {
          if (bVar21) {
            iVar12 = senscr[psVar6[lVar19]];
            if (iVar12 < iVar3 + iVar18) {
              iVar4 = *(int *)((long)g->mgau + lVar15 * 2 + -8);
              if ((iVar4 == -1) || (*(int *)((long)&g->mgau->n_comp + lVar15 * 2) != frame + -1)) {
                senscr[lVar19] = iVar12;
              }
              else {
                single_el_list[0] = iVar4;
                iVar12 = mgau_eval(g,(int32)lVar19,single_el_list,feat,frame,(uint)(bVar20 ^ 1));
                senscr[lVar19] = iVar12;
                local_a4 = local_a4 + 1;
              }
            }
            else {
              iVar11 = approx_mgau_eval(gs,svq,g,fastgmm,(int32)lVar19,senscr,feat,best_cid,svq_beam
                                        ,frame);
              local_a4 = local_a4 + iVar11;
              local_84 = local_84 + 1;
              iVar12 = senscr[lVar19];
            }
            if (iVar17 <= iVar12) {
              iVar17 = iVar12;
            }
          }
        }
        else {
          iVar12 = cache_ci_senscr[lVar19];
          senscr[lVar19] = iVar12;
          if (iVar18 <= iVar12) {
            iVar18 = iVar12;
          }
          if (iVar17 <= iVar12) {
            iVar17 = iVar12;
          }
          puVar7[lVar19] = '\x01';
        }
        puVar8[lVar19] = puVar7[lVar19];
        lVar15 = lVar15 + 0x20;
      }
      for (lVar15 = 0; lVar15 < (int)uVar14; lVar15 = lVar15 + 1) {
        if (puVar7[lVar15] != '\0') {
          senscr[lVar15] = senscr[lVar15] - iVar17;
          uVar14 = (ulong)(uint)g->n_mgau;
        }
      }
      g->frm_sen_eval = local_84;
      g->frm_gau_eval = local_a4;
      return iVar17;
    }
    __assertion = "!(cond_ds > 0 && dist_ds > 0)";
    __line = 0x74;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/approx_cont_mgau.c"
                ,__line,"int32 approx_isskip(int32, fast_gmm_t *, int32)");
}

Assistant:

int32
approx_cont_mgau_frame_eval(mdef_t * mdef,
                            subvq_t * svq,
                            gs_t * gs,
                            mgau_model_t * g,
                            fast_gmm_t * fastgmm,
                            ascr_t * a,
                            float32 * feat,
                            int32 frame,
                            int32 * cache_ci_senscr,
                            ptmr_t * tm_ovrhd,
                            logmath_t * logmath)
{
    int32 s;
    int32 best, ns, ng, n_cis, n_cig;
    int32 best_cid;
    int32 is_skip;
    int32 is_compute;
    int32 pbest;
    int32 is_ciphone;
    int32 svq_beam;
    int32 *ci_occ;
    s3senid_t *cd2cisen;

    int32 total;
    int32 dyn_ci_pbeam;
    float32 tighten_factor;

    int32 single_el_list[2];
    uint8 *sen_active;
    uint8 *rec_sen_active;
    int32 *senscr;

    best = MAX_NEG_INT32;
    pbest = MAX_NEG_INT32;
    ns = 0;
    n_cis = 0;
    n_cig = 0;
    ng = 0;
    total = 0;
    best_cid = -1;


    single_el_list[0] = -1;
    single_el_list[1] = -1;
    svq_beam = fastgmm->gaus->subvqbeam;

    ci_occ = fastgmm->gmms->ci_occu;
    cd2cisen = mdef_cd2cisen(mdef);

    sen_active = a->sen_active;
    rec_sen_active = a->rec_sen_active;
    senscr = a->senscr;

    ptmr_start(tm_ovrhd);
    if (gs)
        best_cid = gc_compute_closest_cw(gs, feat);
    if (svq)
        subvq_gautbl_eval_logs3(svq, feat, logmath);

    if (fastgmm->gmms->max_cd < mdef->n_sen - mdef->n_ci_sen)
        dyn_ci_pbeam = approx_compute_dyn_ci_pbeam(mdef, fastgmm, g,
                                                   ci_occ, sen_active,
                                                   cache_ci_senscr,
                                                   cd2cisen);
    else
        dyn_ci_pbeam = fastgmm->gmms->ci_pbeam;

    tighten_factor = fastgmm->gmms->tighten_factor;

    ptmr_stop(tm_ovrhd);

    is_skip = approx_isskip(frame, fastgmm, best_cid);
    fastgmm->gaus->rec_bstcid = best_cid;

    /* Use the original */

    /* If the frame is "skipped", tighten the beam. */
    if (is_skip) {
        dyn_ci_pbeam = (int32) ((float32) dyn_ci_pbeam * tighten_factor);
    }

    for (s = 0; s < g->n_mgau; s++) {
        is_compute = !sen_active || sen_active[s];
        is_ciphone = mdef_is_cisenone(mdef, s);

#if 0
        if (sen_active[s])
            E_INFO
                ("Sen active %d, rec_sen_active %d, sen id %d cisen id %d, best index %d, update time %d\n",
                 sen_active[s], rec_sen_active[s], s, cd2cisen[s],
                 g->mgau[s].bstidx, g->mgau[s].updatetime);
#endif

        /* Compute the score of the CI phone even if it is not active. */
        if (is_ciphone) {
            /*Just copied from the cache, we just do accouting here */
            /*E_INFO("At senone %d, CI phoneme score %d \n",s,cache_ci_senscr[s]); */
            senscr[s] = cache_ci_senscr[s];
            if (pbest < senscr[s])
                pbest = senscr[s];
            if (best < senscr[s])
                best = senscr[s];
            sen_active[s] = 1;
        }
        else {
            if (is_compute) {
                if ((senscr[cd2cisen[s]] >= pbest + dyn_ci_pbeam)) {
                    ng +=
                        approx_mgau_eval(gs, svq, g, fastgmm, s, senscr,
                                         feat, best_cid, svq_beam, frame);
                    ns++;
                }
                else {

                    /* 3.6 logic: 
                       Whenever it is possible, CD senone score is backed off to the
                       score computed by the best matching index. Otherwise, CI
                       scores will be used.
                     */
                    if (g->mgau[s].bstidx == NO_BSTIDX ||       /* If the gaussian was not computed before. or */
                        g->mgau[s].updatetime != frame - 1      /* It the gaussian was not updated in last frame */
                        ) {
                        /*Previous frames, senone s is not computed. 
                           or the best index is not trusted. 
                           Use CI score in these cases. */
#ifdef GAUDEBUG
                        E_INFO
                            ("USE CI SENONE SCORE at senone %d time %d\n",
                             s, frame);
#endif

                        senscr[s] = senscr[cd2cisen[s]];

                    }
                    else {
                        /*Don't change the bstidx and updatetime */
                        single_el_list[0] = g->mgau[s].bstidx;

                        /*ARCHAN: Please don't rewrite this two lines. I want to make a contrast between the two situations. */
                        if (is_skip)
                            senscr[s] = mgau_eval(g, s, single_el_list, feat, frame, 1);        /*Update the best idx, such that next frames can use it */
                        else
                            senscr[s] = mgau_eval(g, s, single_el_list, feat, frame, 0);        /*Not update the best index in a Gaussian */

                        ng++;   /* But don't increase the number of senone compute. It doesn't count. */

#ifdef GAUDEBUG
                        E_INFO
                            ("RECOMPUTE for senone %d USING BEST INDEX %d time %d, single Gauss score %d, ci score %d, last ci score %d. \n",
                             s, g->mgau[s].bstidx, frame, senscr[s],
                             senscr[cd2cisen[s]], g->mgau[s].bstscr);
#endif

                    }
                }
                if (best < senscr[s])
                    best = senscr[s];
            }
        }
        /*Make a copy to the most recent active list */
        rec_sen_active[s] = sen_active[s];
    }

    for (s = 0; s < g->n_mgau; s++) {
        if (sen_active[s])
            senscr[s] -= best;
    }


    /*Don't delete this line, it is very useful in analysing the performance */

#if APPROX_ANALYSE
    E_INFO("time: %d , cisen %d, sen: %d, gau: %d\n", frame, n_cis, ns,
           ng);
#endif

    g->frm_sen_eval = ns;
    g->frm_gau_eval = ng;
    ci_occ = NULL;
    return best;


}